

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

void __thiscall
doctest::anon_unknown_14::JUnitReporter::test_case_reenter(JUnitReporter *this,TestCaseData *in)

{
  ticks_t tVar1;
  char *__s;
  TestCaseData *file;
  double dVar2;
  allocator<char> local_82;
  allocator<char> local_81;
  string local_80;
  string local_60;
  vector<doctest::String,_std::allocator<doctest::String>_> local_40;
  
  dVar2 = detail::Timer::getElapsedSeconds(&this->timer);
  dVar2 = (double)(~-(ulong)(dVar2 < 0.0001) & (ulong)dVar2);
  (this->testCaseData).testcases.
  super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase>_>
  ._M_impl.super__Vector_impl_data._M_finish[-1].time = dVar2;
  (this->testCaseData).totalSeconds = (this->testCaseData).totalSeconds + dVar2;
  std::vector<doctest::String,_std::allocator<doctest::String>_>::vector
            (&local_40,&this->deepestSubcaseStackNames);
  JUnitTestCaseData::appendSubcaseNamesToLastTestcase(&this->testCaseData,&local_40);
  std::vector<doctest::String,_std::allocator<doctest::String>_>::~vector(&local_40);
  std::vector<doctest::String,_std::allocator<doctest::String>_>::clear
            (&this->deepestSubcaseStackNames);
  tVar1 = detail::getCurrentTicks();
  (this->timer).m_ticks = tVar1;
  file = in;
  if ((in->m_file).field_0.buf[0x17] < '\0') {
    file = (TestCaseData *)(in->m_file).field_0.data.ptr;
  }
  __s = skipPathFromFilename((char *)file);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,__s,&local_81);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,in->m_name,&local_82);
  JUnitTestCaseData::add(&this->testCaseData,&local_60,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

void test_case_reenter(const TestCaseData& in) override {
            testCaseData.addTime(timer.getElapsedSeconds());
            testCaseData.appendSubcaseNamesToLastTestcase(deepestSubcaseStackNames);
            deepestSubcaseStackNames.clear();

            timer.start();
            testCaseData.add(skipPathFromFilename(in.m_file.c_str()), in.m_name);
        }